

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O3

bool ON_SubD::AutomaticMeshToSubD(AutomaticMeshToSubDContext context)

{
  bool *pbVar1;
  undefined3 in_register_00000039;
  
  if (CONCAT31(in_register_00000039,context) == 2) {
    pbVar1 = &AutomaticFBXMeshWithDivisionLevelsToSubD;
  }
  else {
    if (CONCAT31(in_register_00000039,context) != 1) {
      return false;
    }
    pbVar1 = &AutomaticRhino5BoxModeTSplineToSubD;
  }
  return *pbVar1;
}

Assistant:

bool ON_SubD::AutomaticMeshToSubD(
  ON_SubD::AutomaticMeshToSubDContext context
)
{
  bool bAutomaticallyCreateSubD;
  switch (context)
  {
  case ON_SubD::AutomaticMeshToSubDContext::Unset:
    bAutomaticallyCreateSubD = false;
    break;
  case ON_SubD::AutomaticMeshToSubDContext::Rhino5BoxModeTSpline:
    bAutomaticallyCreateSubD = ON_SubD::AutomaticRhino5BoxModeTSplineToSubD;
    break;
  case ON_SubD::AutomaticMeshToSubDContext::FBXMeshWithDivisionLevels:
    bAutomaticallyCreateSubD = ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubD;
    break;
  default:
    bAutomaticallyCreateSubD = false;
    break;
  }
  return bAutomaticallyCreateSubD;
}